

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

xmlHashTablePtr xmlHashCreate(int size)

{
  uint uVar1;
  uint size_00;
  int iVar2;
  xmlHashTablePtr hash;
  
  xmlInitParser();
  hash = (xmlHashTablePtr)(*xmlMalloc)(0x20);
  if (hash != (xmlHashTablePtr)0x0) {
    hash->table = (xmlHashEntry *)0x0;
    hash->size = 0;
    hash->nbElems = 0;
    hash->dict = (xmlDictPtr)0x0;
    uVar1 = xmlRandom();
    hash->randomSeed = uVar1;
    if (size < 9) {
      return hash;
    }
    uVar1 = 0x10;
    do {
      size_00 = uVar1;
      if ((uint)size <= size_00) break;
      uVar1 = size_00 * 2;
    } while (-1 < (int)size_00);
    iVar2 = xmlHashGrow(hash,size_00);
    if (iVar2 == 0) {
      return hash;
    }
    (*xmlFree)(hash);
  }
  return (xmlHashTablePtr)0x0;
}

Assistant:

xmlHashTablePtr
xmlHashCreate(int size) {
    xmlHashTablePtr hash;

    xmlInitParser();

    hash = xmlMalloc(sizeof(*hash));
    if (hash == NULL)
        return(NULL);
    hash->dict = NULL;
    hash->size = 0;
    hash->table = NULL;
    hash->nbElems = 0;
    hash->randomSeed = xmlRandom();
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    hash->randomSeed = 0;
#endif

    /*
     * Unless a larger size is passed, the backing table is created
     * lazily with MIN_HASH_SIZE capacity. In practice, there are many
     * hash tables which are never filled.
     */
    if (size > MIN_HASH_SIZE) {
        unsigned newSize = MIN_HASH_SIZE * 2;

        while ((newSize < (unsigned) size) && (newSize < MAX_HASH_SIZE))
            newSize *= 2;

        if (xmlHashGrow(hash, newSize) != 0) {
            xmlFree(hash);
            return(NULL);
        }
    }

    return(hash);
}